

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Version.cpp
# Opt level: O1

string * __thiscall
llbuild::getLLBuildFullVersion_abi_cxx11_
          (string *__return_storage_ptr__,llbuild *this,StringRef productName)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20;
  undefined7 uStack_1f;
  
  local_30 = &local_20;
  if (this == (llbuild *)0x0) {
    local_28 = 0;
    local_20 = 0;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,this,productName.Data + (long)this,productName.Length);
  }
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_30);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar3) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_30 != &local_20) {
    operator_delete(local_30,CONCAT71(uStack_1f,local_20) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getLLBuildFullVersion(StringRef productName) {
  std::string result = productName.str() + " version 5.2";

  // Include the additional build version information, if present.
#ifdef LLBUILD_VENDOR_STRING
  result = std::string(LLBUILD_VENDOR_STRING) + " " + result;
#endif
#ifdef LLBUILD_VERSION_STRING
  result = result + " (" + std::string(LLBUILD_VERSION_STRING) + ")";
#endif

  return result;
}